

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTreeTest.cc
# Opt level: O0

void run_basic_test(void)

{
  initializer_list<Entry> __l;
  bool bVar1;
  size_t sVar2;
  long *plVar3;
  size_type sVar4;
  const_iterator __first;
  const_iterator __last;
  pair<phosg::Vector2<long>,_long> *ppVar5;
  pair<std::_Rb_tree_const_iterator<Entry>,_bool> pVar6;
  anon_union_8_2_94730018_for_Vector2<long>_1 local_a38;
  anon_union_8_2_94730038_for_Vector2<long>_3 local_a30;
  long local_a28;
  reference local_a20;
  pair<phosg::Vector2<long>,_long> *it_4;
  iterator __end1_3;
  iterator __begin1_3;
  Vector2<long> local_9f8;
  vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
  local_9e8;
  vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
  *local_9d0;
  vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
  *__range1_3;
  undefined1 local_9c0;
  value_type local_9b8;
  undefined1 local_9a0 [8];
  set<Entry,_std::less<Entry>,_std::allocator<Entry>_> remaining_entries_4;
  pair<phosg::Vector2<long>,_long> *it_3;
  Iterator __end1_2;
  Iterator __begin1_2;
  KDTree<phosg::Vector2<long>,_long> *__range1_2;
  int64_t local_870;
  int64_t local_868;
  key_type local_860;
  Entry *local_848;
  __normal_iterator<const_Entry_*,_std::vector<Entry,_std::allocator<Entry>_>_> local_840;
  undefined1 local_838 [8];
  set<Entry,_std::less<Entry>,_std::allocator<Entry>_> remaining_entries_3;
  Iterator local_7f0;
  undefined1 local_788 [8];
  Iterator it_2;
  undefined1 local_6f8 [8];
  set<Entry,_std::less<Entry>,_std::allocator<Entry>_> remaining_entries_2;
  pair<phosg::Vector2<long>,_long> *it_1;
  Iterator __end1_1;
  Iterator __begin1_1;
  KDTree<phosg::Vector2<long>,_long> *__range1_1;
  int64_t local_5c8;
  int64_t local_5c0;
  Entry *local_5b8;
  __normal_iterator<const_Entry_*,_std::vector<Entry,_std::allocator<Entry>_>_> local_5b0;
  undefined1 local_5a8 [8];
  set<Entry,_std::less<Entry>,_std::allocator<Entry>_> remaining_entries_1;
  Vector2<long> local_570;
  long local_560;
  Vector2<long> local_558;
  long local_548;
  Vector2<long> local_540;
  anon_union_8_2_94730018_for_Vector2<long>_1 local_530;
  anon_union_8_2_94730038_for_Vector2<long>_3 local_528;
  long local_520;
  reference local_518;
  pair<phosg::Vector2<long>,_long> *it;
  iterator __end1;
  iterator __begin1;
  Vector2<long> local_4f0;
  vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
  local_4e0;
  vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
  *local_4c8;
  vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
  *__range1;
  undefined1 local_4b8;
  value_type local_4b0;
  _Base_ptr local_498;
  undefined1 local_490;
  value_type local_488;
  undefined1 local_470 [8];
  set<Entry,_std::less<Entry>,_std::allocator<Entry>_> remaining_entries;
  Vector2<long> local_430;
  anon_class_8_1_54a39814 local_420;
  function<void_()> local_418;
  Vector2<long> local_3f8;
  long local_3e8;
  Vector2<long> local_3e0;
  Iterator local_3d0;
  long local_368;
  Vector2<long> local_360;
  Iterator local_350;
  long local_2e8;
  Vector2<long> local_2e0;
  Iterator local_2d0;
  long local_268;
  Vector2<long> local_260;
  Iterator local_250;
  long local_1e8;
  Vector2<long> local_1e0;
  Iterator local_1d0;
  long local_168;
  Vector2<long> local_160;
  Iterator local_150;
  allocator<Entry> local_e1;
  Entry local_e0 [6];
  iterator local_50;
  size_type local_48;
  undefined1 local_40 [8];
  vector<Entry,_std::allocator<Entry>_> entries;
  undefined1 local_18 [8];
  KDTree<phosg::Vector2<long>,_long> t;
  
  printf("-- basic\n");
  printf("--   construction\n");
  phosg::KDTree<phosg::Vector2<long>,_long>::KDTree((KDTree<phosg::Vector2<long>,_long> *)local_18);
  sVar2 = phosg::KDTree<phosg::Vector2<long>,_long>::size
                    ((KDTree<phosg::Vector2<long>,_long> *)local_18);
  phosg::expect_generic
            (sVar2 == 0,"t.size() != 0",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0x5e);
  memcpy(local_e0,&DAT_0013e018,0x90);
  local_48 = 6;
  local_50 = local_e0;
  std::allocator<Entry>::allocator(&local_e1);
  __l._M_len = local_48;
  __l._M_array = local_50;
  std::vector<Entry,_std::allocator<Entry>_>::vector
            ((vector<Entry,_std::allocator<Entry>_> *)local_40,__l,&local_e1);
  std::allocator<Entry>::~allocator(&local_e1);
  printf("--   insert\n");
  phosg::Vector2<long>::Vector2(&local_160,2,3);
  local_168 = 0;
  phosg::KDTree<phosg::Vector2<long>,_long>::insert
            (&local_150,(KDTree<phosg::Vector2<long>,_long> *)local_18,&local_160,&local_168);
  phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::~Iterator(&local_150);
  phosg::Vector2<long>::Vector2(&local_1e0,5,4);
  local_1e8 = 1;
  phosg::KDTree<phosg::Vector2<long>,_long>::insert
            (&local_1d0,(KDTree<phosg::Vector2<long>,_long> *)local_18,&local_1e0,&local_1e8);
  phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::~Iterator(&local_1d0);
  phosg::Vector2<long>::Vector2(&local_260,9,6);
  local_268 = 2;
  phosg::KDTree<phosg::Vector2<long>,_long>::insert
            (&local_250,(KDTree<phosg::Vector2<long>,_long> *)local_18,&local_260,&local_268);
  phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::~Iterator(&local_250);
  phosg::Vector2<long>::Vector2(&local_2e0,4,7);
  local_2e8 = 3;
  phosg::KDTree<phosg::Vector2<long>,_long>::insert
            (&local_2d0,(KDTree<phosg::Vector2<long>,_long> *)local_18,&local_2e0,&local_2e8);
  phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::~Iterator(&local_2d0);
  phosg::Vector2<long>::Vector2(&local_360,8,1);
  local_368 = 4;
  phosg::KDTree<phosg::Vector2<long>,_long>::insert
            (&local_350,(KDTree<phosg::Vector2<long>,_long> *)local_18,&local_360,&local_368);
  phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::~Iterator(&local_350);
  phosg::Vector2<long>::Vector2(&local_3e0,7,2);
  local_3e8 = 5;
  phosg::KDTree<phosg::Vector2<long>,_long>::insert
            (&local_3d0,(KDTree<phosg::Vector2<long>,_long> *)local_18,&local_3e0,&local_3e8);
  phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::~Iterator(&local_3d0);
  printf("--   at/exists\n");
  sVar2 = phosg::KDTree<phosg::Vector2<long>,_long>::size
                    ((KDTree<phosg::Vector2<long>,_long> *)local_18);
  phosg::expect_generic
            (sVar2 == 6,"6 != t.size()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0x87);
  phosg::Vector2<long>::Vector2(&local_3f8,8,1);
  plVar3 = phosg::KDTree<phosg::Vector2<long>,_long>::at
                     ((KDTree<phosg::Vector2<long>,_long> *)local_18,&local_3f8);
  phosg::expect_generic
            (*plVar3 == 4,"4 != t.at({8, 1})",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0x88);
  local_420.t = (KDTree<phosg::Vector2<long>,_long> *)local_18;
  std::function<void()>::function<run_basic_test()::__0,void>
            ((function<void()> *)&local_418,&local_420);
  phosg::expect_raises_fn<std::out_of_range>
            ("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0x8b,&local_418);
  std::function<void_()>::~function(&local_418);
  phosg::Vector2<long>::Vector2(&local_430,5,4);
  bVar1 = phosg::KDTree<phosg::Vector2<long>,_long>::exists
                    ((KDTree<phosg::Vector2<long>,_long> *)local_18,&local_430);
  phosg::expect_generic
            (bVar1,"true != t.exists({5, 4})",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0x8c);
  phosg::Vector2<long>::Vector2
            ((Vector2<long> *)&remaining_entries._M_t._M_impl.super__Rb_tree_header._M_node_count,5,
             3);
  bVar1 = phosg::KDTree<phosg::Vector2<long>,_long>::exists
                    ((KDTree<phosg::Vector2<long>,_long> *)local_18,
                     (Vector2<long> *)
                     &remaining_entries._M_t._M_impl.super__Rb_tree_header._M_node_count);
  phosg::expect_generic
            ((bool)(~bVar1 & 1),"false != t.exists({5, 3})",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0x8d);
  printf("--   within\n");
  std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::set
            ((set<Entry,_std::less<Entry>,_std::allocator<Entry>_> *)local_470);
  local_488.x = 2;
  local_488.y = 3;
  local_488.v = 0;
  pVar6 = std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::insert
                    ((set<Entry,_std::less<Entry>,_std::allocator<Entry>_> *)local_470,&local_488);
  local_498 = (_Base_ptr)pVar6.first._M_node;
  local_490 = pVar6.second;
  local_4b0.x = 4;
  local_4b0.y = 7;
  local_4b0.v = 3;
  pVar6 = std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::insert
                    ((set<Entry,_std::less<Entry>,_std::allocator<Entry>_> *)local_470,&local_4b0);
  __range1 = (vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
              *)pVar6.first._M_node;
  local_4b8 = pVar6.second;
  phosg::Vector2<long>::Vector2(&local_4f0,0,0);
  phosg::Vector2<long>::Vector2((Vector2<long> *)&__begin1,5,10);
  phosg::KDTree<phosg::Vector2<long>,_long>::within
            (&local_4e0,(KDTree<phosg::Vector2<long>,_long> *)local_18,&local_4f0,
             (Vector2<long> *)&__begin1);
  local_4c8 = &local_4e0;
  __end1 = std::
           vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
           ::begin(local_4c8);
  it = (pair<phosg::Vector2<long>,_long> *)
       std::
       vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
       ::end(local_4c8);
  while (bVar1 = __gnu_cxx::
                 operator==<std::pair<phosg::Vector2<long>,_long>_*,_std::vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>_>
                           (&__end1,(__normal_iterator<std::pair<phosg::Vector2<long>,_long>_*,_std::vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>_>
                                     *)&it), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_518 = __gnu_cxx::
                __normal_iterator<std::pair<phosg::Vector2<long>,_long>_*,_std::vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>_>
                ::operator*(&__end1);
    local_530 = (local_518->first).field_0;
    local_528 = (local_518->first).field_1;
    local_520 = local_518->second;
    sVar4 = std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::erase
                      ((set<Entry,_std::less<Entry>,_std::allocator<Entry>_> *)local_470,
                       (key_type *)&local_530);
    phosg::expect_generic
              (sVar4 == 1,"1 != remaining_entries.erase({it.first.x, it.first.y, it.second})",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
               ,0x95);
    __gnu_cxx::
    __normal_iterator<std::pair<phosg::Vector2<long>,_long>_*,_std::vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
  ::~vector(&local_4e0);
  sVar4 = std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::size
                    ((set<Entry,_std::less<Entry>,_std::allocator<Entry>_> *)local_470);
  phosg::expect_generic
            (sVar4 == 0,"0 != remaining_entries.size()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0x97);
  std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::~set
            ((set<Entry,_std::less<Entry>,_std::allocator<Entry>_> *)local_470);
  printf("--   erase\n");
  phosg::Vector2<long>::Vector2(&local_540,8,6);
  local_548 = 2;
  bVar1 = phosg::KDTree<phosg::Vector2<long>,_long>::erase
                    ((KDTree<phosg::Vector2<long>,_long> *)local_18,&local_540,&local_548);
  phosg::expect_generic
            ((bool)(~bVar1 & 1),"false != t.erase({8, 6}, 2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0x9b);
  sVar2 = phosg::KDTree<phosg::Vector2<long>,_long>::size
                    ((KDTree<phosg::Vector2<long>,_long> *)local_18);
  phosg::expect_generic
            (sVar2 == 6,"6 != t.size()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0x9c);
  phosg::Vector2<long>::Vector2(&local_558,9,6);
  local_560 = 1;
  bVar1 = phosg::KDTree<phosg::Vector2<long>,_long>::erase
                    ((KDTree<phosg::Vector2<long>,_long> *)local_18,&local_558,&local_560);
  phosg::expect_generic
            ((bool)(~bVar1 & 1),"false != t.erase({9, 6}, 1)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0x9d);
  sVar2 = phosg::KDTree<phosg::Vector2<long>,_long>::size
                    ((KDTree<phosg::Vector2<long>,_long> *)local_18);
  phosg::expect_generic
            (sVar2 == 6,"6 != t.size()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0x9e);
  phosg::Vector2<long>::Vector2(&local_570,9,6);
  remaining_entries_1._M_t._M_impl.super__Rb_tree_header._M_node_count = 2;
  bVar1 = phosg::KDTree<phosg::Vector2<long>,_long>::erase
                    ((KDTree<phosg::Vector2<long>,_long> *)local_18,&local_570,
                     (long *)&remaining_entries_1._M_t._M_impl.super__Rb_tree_header._M_node_count);
  phosg::expect_generic
            (bVar1,"true != t.erase({9, 6}, 2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0x9f);
  sVar2 = phosg::KDTree<phosg::Vector2<long>,_long>::size
                    ((KDTree<phosg::Vector2<long>,_long> *)local_18);
  phosg::expect_generic
            (sVar2 == 5,"5 != t.size()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0xa0);
  printf("--   iterate\n");
  local_5b0._M_current =
       (Entry *)std::vector<Entry,_std::allocator<Entry>_>::begin
                          ((vector<Entry,_std::allocator<Entry>_> *)local_40);
  local_5b8 = (Entry *)std::vector<Entry,_std::allocator<Entry>_>::end
                                 ((vector<Entry,_std::allocator<Entry>_> *)local_40);
  std::
  set<run_basic_test()::Entry,std::less<run_basic_test()::Entry>,std::allocator<run_basic_test()::Entry>>
  ::
  set<__gnu_cxx::__normal_iterator<run_basic_test()::Entry_const*,std::vector<run_basic_test()::Entry,std::allocator<run_basic_test()::Entry>>>>
            ((set<run_basic_test()::Entry,std::less<run_basic_test()::Entry>,std::allocator<run_basic_test()::Entry>>
              *)local_5a8,local_5b0,
             (__normal_iterator<const_Entry_*,_std::vector<Entry,_std::allocator<Entry>_>_>)
             local_5b8);
  __range1_1 = (KDTree<phosg::Vector2<long>,_long> *)0x9;
  local_5c8 = 6;
  local_5c0 = 2;
  sVar4 = std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::erase
                    ((set<Entry,_std::less<Entry>,_std::allocator<Entry>_> *)local_5a8,
                     (key_type *)&__range1_1);
  phosg::expect_generic
            (sVar4 == 1,"1 != remaining_entries.erase({9, 6, 2})",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0xa5);
  phosg::KDTree<phosg::Vector2<long>,_long>::begin
            ((Iterator *)&__end1_1.current.second,(KDTree<phosg::Vector2<long>,_long> *)local_18);
  phosg::KDTree<phosg::Vector2<long>,_long>::end
            ((Iterator *)&it_1,(KDTree<phosg::Vector2<long>,_long> *)local_18);
  while (bVar1 = phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator!=
                           ((Iterator *)&__end1_1.current.second,(Iterator *)&it_1), bVar1) {
    ppVar5 = phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator*
                       ((Iterator *)&__end1_1.current.second);
    remaining_entries_2._M_t._M_impl.super__Rb_tree_header._M_node_count = (ppVar5->first).field_0.x
    ;
    sVar4 = std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::erase
                      ((set<Entry,_std::less<Entry>,_std::allocator<Entry>_> *)local_5a8,
                       (key_type *)
                       &remaining_entries_2._M_t._M_impl.super__Rb_tree_header._M_node_count);
    phosg::expect_generic
              (sVar4 == 1,"1 != remaining_entries.erase({it.first.x, it.first.y, it.second})",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
               ,0xa7);
    phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator++
              ((Iterator *)&__end1_1.current.second);
  }
  phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::~Iterator((Iterator *)&it_1);
  phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::~Iterator
            ((Iterator *)&__end1_1.current.second);
  sVar4 = std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::size
                    ((set<Entry,_std::less<Entry>,_std::allocator<Entry>_> *)local_5a8);
  phosg::expect_generic
            (sVar4 == 0,"0 != remaining_entries.size()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0xa9);
  std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::~set
            ((set<Entry,_std::less<Entry>,_std::allocator<Entry>_> *)local_5a8);
  printf("--   iterate+erase\n");
  __first = std::vector<Entry,_std::allocator<Entry>_>::begin
                      ((vector<Entry,_std::allocator<Entry>_> *)local_40);
  __last = std::vector<Entry,_std::allocator<Entry>_>::end
                     ((vector<Entry,_std::allocator<Entry>_> *)local_40);
  std::
  set<run_basic_test()::Entry,std::less<run_basic_test()::Entry>,std::allocator<run_basic_test()::Entry>>
  ::
  set<__gnu_cxx::__normal_iterator<run_basic_test()::Entry_const*,std::vector<run_basic_test()::Entry,std::allocator<run_basic_test()::Entry>>>>
            ((set<run_basic_test()::Entry,std::less<run_basic_test()::Entry>,std::allocator<run_basic_test()::Entry>>
              *)local_6f8,
             (__normal_iterator<const_Entry_*,_std::vector<Entry,_std::allocator<Entry>_>_>)
             __first._M_current,
             (__normal_iterator<const_Entry_*,_std::vector<Entry,_std::allocator<Entry>_>_>)
             __last._M_current);
  it_2.current.second = 9;
  sVar4 = std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::erase
                    ((set<Entry,_std::less<Entry>,_std::allocator<Entry>_> *)local_6f8,
                     (key_type *)&it_2.current.second);
  phosg::expect_generic
            (sVar4 == 1,"1 != remaining_entries.erase({9, 6, 2})",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0xaf);
  phosg::KDTree<phosg::Vector2<long>,_long>::begin
            ((Iterator *)local_788,(KDTree<phosg::Vector2<long>,_long> *)local_18);
  while( true ) {
    phosg::KDTree<phosg::Vector2<long>,_long>::end
              (&local_7f0,(KDTree<phosg::Vector2<long>,_long> *)local_18);
    bVar1 = phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator!=
                      ((Iterator *)local_788,&local_7f0);
    phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::~Iterator(&local_7f0);
    if (!bVar1) break;
    ppVar5 = phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator->((Iterator *)local_788);
    remaining_entries_3._M_t._M_impl.super__Rb_tree_header._M_node_count = (ppVar5->first).field_0.x
    ;
    phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator->((Iterator *)local_788);
    phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator->((Iterator *)local_788);
    sVar4 = std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::erase
                      ((set<Entry,_std::less<Entry>,_std::allocator<Entry>_> *)local_6f8,
                       (key_type *)
                       &remaining_entries_3._M_t._M_impl.super__Rb_tree_header._M_node_count);
    phosg::expect_generic
              (sVar4 == 1,"1 != remaining_entries.erase({it->first.x, it->first.y, it->second})",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
               ,0xb1);
    ppVar5 = phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator->((Iterator *)local_788);
    if ((ppVar5->first).field_0.x == 4) {
      phosg::KDTree<phosg::Vector2<long>,_long>::erase_advance
                ((KDTree<phosg::Vector2<long>,_long> *)local_18,(Iterator *)local_788);
    }
    else {
      phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator++((Iterator *)local_788);
    }
  }
  phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::~Iterator((Iterator *)local_788);
  sVar4 = std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::size
                    ((set<Entry,_std::less<Entry>,_std::allocator<Entry>_> *)local_6f8);
  phosg::expect_generic
            (sVar4 == 0,"0 != remaining_entries.size()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0xb8);
  std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::~set
            ((set<Entry,_std::less<Entry>,_std::allocator<Entry>_> *)local_6f8);
  printf("--   ensure committed (iterate)\n");
  local_840._M_current =
       (Entry *)std::vector<Entry,_std::allocator<Entry>_>::begin
                          ((vector<Entry,_std::allocator<Entry>_> *)local_40);
  local_848 = (Entry *)std::vector<Entry,_std::allocator<Entry>_>::end
                                 ((vector<Entry,_std::allocator<Entry>_> *)local_40);
  std::
  set<run_basic_test()::Entry,std::less<run_basic_test()::Entry>,std::allocator<run_basic_test()::Entry>>
  ::
  set<__gnu_cxx::__normal_iterator<run_basic_test()::Entry_const*,std::vector<run_basic_test()::Entry,std::allocator<run_basic_test()::Entry>>>>
            ((set<run_basic_test()::Entry,std::less<run_basic_test()::Entry>,std::allocator<run_basic_test()::Entry>>
              *)local_838,local_840,
             (__normal_iterator<const_Entry_*,_std::vector<Entry,_std::allocator<Entry>_>_>)
             local_848);
  local_860.x = 9;
  local_860.y = 6;
  local_860.v = 2;
  sVar4 = std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::erase
                    ((set<Entry,_std::less<Entry>,_std::allocator<Entry>_> *)local_838,&local_860);
  phosg::expect_generic
            (sVar4 == 1,"1 != remaining_entries.erase({9, 6, 2})",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0xbe);
  __range1_2 = (KDTree<phosg::Vector2<long>,_long> *)0x4;
  local_870 = 7;
  local_868 = 3;
  sVar4 = std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::erase
                    ((set<Entry,_std::less<Entry>,_std::allocator<Entry>_> *)local_838,
                     (key_type *)&__range1_2);
  phosg::expect_generic
            (sVar4 == 1,"1 != remaining_entries.erase({4, 7, 3})",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0xbf);
  phosg::KDTree<phosg::Vector2<long>,_long>::begin
            ((Iterator *)&__end1_2.current.second,(KDTree<phosg::Vector2<long>,_long> *)local_18);
  phosg::KDTree<phosg::Vector2<long>,_long>::end
            ((Iterator *)&it_3,(KDTree<phosg::Vector2<long>,_long> *)local_18);
  while (bVar1 = phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator!=
                           ((Iterator *)&__end1_2.current.second,(Iterator *)&it_3), bVar1) {
    ppVar5 = phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator*
                       ((Iterator *)&__end1_2.current.second);
    remaining_entries_4._M_t._M_impl.super__Rb_tree_header._M_node_count = (ppVar5->first).field_0.x
    ;
    sVar4 = std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::erase
                      ((set<Entry,_std::less<Entry>,_std::allocator<Entry>_> *)local_838,
                       (key_type *)
                       &remaining_entries_4._M_t._M_impl.super__Rb_tree_header._M_node_count);
    phosg::expect_generic
              (sVar4 == 1,"1 != remaining_entries.erase({it.first.x, it.first.y, it.second})",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
               ,0xc1);
    phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::operator++
              ((Iterator *)&__end1_2.current.second);
  }
  phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::~Iterator((Iterator *)&it_3);
  phosg::KDTree<phosg::Vector2<long>,_long>::Iterator::~Iterator
            ((Iterator *)&__end1_2.current.second);
  sVar4 = std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::size
                    ((set<Entry,_std::less<Entry>,_std::allocator<Entry>_> *)local_838);
  phosg::expect_generic
            (sVar4 == 0,"0 != remaining_entries.size()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0xc3);
  std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::~set
            ((set<Entry,_std::less<Entry>,_std::allocator<Entry>_> *)local_838);
  printf("--   ensure committed (within)\n");
  std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::set
            ((set<Entry,_std::less<Entry>,_std::allocator<Entry>_> *)local_9a0);
  local_9b8.x = 2;
  local_9b8.y = 3;
  local_9b8.v = 0;
  pVar6 = std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::insert
                    ((set<Entry,_std::less<Entry>,_std::allocator<Entry>_> *)local_9a0,&local_9b8);
  __range1_3 = (vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
                *)pVar6.first._M_node;
  local_9c0 = pVar6.second;
  phosg::Vector2<long>::Vector2(&local_9f8,0,0);
  phosg::Vector2<long>::Vector2((Vector2<long> *)&__begin1_3,5,10);
  phosg::KDTree<phosg::Vector2<long>,_long>::within
            (&local_9e8,(KDTree<phosg::Vector2<long>,_long> *)local_18,&local_9f8,
             (Vector2<long> *)&__begin1_3);
  local_9d0 = &local_9e8;
  __end1_3 = std::
             vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
             ::begin(local_9d0);
  it_4 = (pair<phosg::Vector2<long>,_long> *)
         std::
         vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
         ::end(local_9d0);
  while (bVar1 = __gnu_cxx::
                 operator==<std::pair<phosg::Vector2<long>,_long>_*,_std::vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>_>
                           (&__end1_3,
                            (__normal_iterator<std::pair<phosg::Vector2<long>,_long>_*,_std::vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>_>
                             *)&it_4), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_a20 = __gnu_cxx::
                __normal_iterator<std::pair<phosg::Vector2<long>,_long>_*,_std::vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>_>
                ::operator*(&__end1_3);
    local_a38 = (local_a20->first).field_0;
    local_a30 = (local_a20->first).field_1;
    local_a28 = local_a20->second;
    sVar4 = std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::erase
                      ((set<Entry,_std::less<Entry>,_std::allocator<Entry>_> *)local_9a0,
                       (key_type *)&local_a38);
    phosg::expect_generic
              (sVar4 == 1,"1 != remaining_entries.erase({it.first.x, it.first.y, it.second})",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
               ,0xcb);
    __gnu_cxx::
    __normal_iterator<std::pair<phosg::Vector2<long>,_long>_*,_std::vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>_>
    ::operator++(&__end1_3);
  }
  std::
  vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
  ::~vector(&local_9e8);
  sVar4 = std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::size
                    ((set<Entry,_std::less<Entry>,_std::allocator<Entry>_> *)local_9a0);
  phosg::expect_generic
            (sVar4 == 0,"0 != remaining_entries.size()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/KDTreeTest.cc"
             ,0xcd);
  std::set<Entry,_std::less<Entry>,_std::allocator<Entry>_>::~set
            ((set<Entry,_std::less<Entry>,_std::allocator<Entry>_> *)local_9a0);
  std::vector<Entry,_std::allocator<Entry>_>::~vector
            ((vector<Entry,_std::allocator<Entry>_> *)local_40);
  phosg::KDTree<phosg::Vector2<long>,_long>::~KDTree((KDTree<phosg::Vector2<long>,_long> *)local_18)
  ;
  return;
}

Assistant:

void run_basic_test() {
  printf("-- basic\n");

  printf("--   construction\n");

  KDTree<Vector2<int64_t>, int64_t> t;
  expect_eq(t.size(), 0);

  struct Entry {
    int64_t x;
    int64_t y;
    int64_t v;

    bool operator<(const Entry& other) const {
      if (this->x < other.x) {
        return true;
      }
      if (this->x > other.x) {
        return false;
      }
      if (this->y < other.y) {
        return true;
      }
      if (this->y > other.y) {
        return false;
      }
      return (this->v < other.v);
    }
  };
  const vector<Entry> entries({
      {2, 3, 0},
      {5, 4, 1},
      {9, 6, 2},
      {4, 7, 3},
      {8, 1, 4},
      {7, 2, 5},
  });

  printf("--   insert\n");
  t.insert({2, 3}, 0);
  t.insert({5, 4}, 1);
  t.insert({9, 6}, 2);
  t.insert({4, 7}, 3);
  t.insert({8, 1}, 4);
  t.insert({7, 2}, 5);

  printf("--   at/exists\n");
  expect_eq(6, t.size());
  expect_eq(4, t.at({8, 1}));
  expect_raises(out_of_range, [&]() {
    t.at({8, 2});
  });
  expect_eq(true, t.exists({5, 4}));
  expect_eq(false, t.exists({5, 3}));

  printf("--   within\n");
  {
    set<Entry> remaining_entries;
    remaining_entries.insert({2, 3, 0});
    remaining_entries.insert({4, 7, 3});
    for (const auto& it : t.within({0, 0}, {5, 10})) {
      expect_eq(1, remaining_entries.erase({it.first.x, it.first.y, it.second}));
    }
    expect_eq(0, remaining_entries.size());
  }

  printf("--   erase\n");
  expect_eq(false, t.erase({8, 6}, 2));
  expect_eq(6, t.size());
  expect_eq(false, t.erase({9, 6}, 1));
  expect_eq(6, t.size());
  expect_eq(true, t.erase({9, 6}, 2));
  expect_eq(5, t.size());

  printf("--   iterate\n");
  {
    set<Entry> remaining_entries(entries.begin(), entries.end());
    expect_eq(1, remaining_entries.erase({9, 6, 2}));
    for (const auto& it : t) {
      expect_eq(1, remaining_entries.erase({it.first.x, it.first.y, it.second}));
    }
    expect_eq(0, remaining_entries.size());
  }

  printf("--   iterate+erase\n");
  {
    set<Entry> remaining_entries(entries.begin(), entries.end());
    expect_eq(1, remaining_entries.erase({9, 6, 2}));
    for (auto it = t.begin(); it != t.end();) {
      expect_eq(1, remaining_entries.erase({it->first.x, it->first.y, it->second}));
      if (it->first.x == 4) {
        t.erase_advance(it);
      } else {
        ++it;
      }
    }
    expect_eq(0, remaining_entries.size());
  }

  printf("--   ensure committed (iterate)\n");
  {
    set<Entry> remaining_entries(entries.begin(), entries.end());
    expect_eq(1, remaining_entries.erase({9, 6, 2}));
    expect_eq(1, remaining_entries.erase({4, 7, 3}));
    for (const auto& it : t) {
      expect_eq(1, remaining_entries.erase({it.first.x, it.first.y, it.second}));
    }
    expect_eq(0, remaining_entries.size());
  }

  printf("--   ensure committed (within)\n");
  {
    set<Entry> remaining_entries;
    remaining_entries.insert({2, 3, 0});
    for (const auto& it : t.within({0, 0}, {5, 10})) {
      expect_eq(1, remaining_entries.erase({it.first.x, it.first.y, it.second}));
    }
    expect_eq(0, remaining_entries.size());
  }
}